

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymTable.cpp
# Opt level: O3

PropertySym * __thiscall SymTable::FindPropertySym(SymTable *this,SymID stackSymID,int32 propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  undefined1 local_2c [8];
  SymIdPropIdPair pair;
  PropertySym *propertySym;
  
  pair.second = 0;
  pair.initialized = false;
  pair._9_3_ = 0;
  uVar4 = stackSymID + this->m_IDAdjustment;
  pair.first._0_1_ = 1;
  local_2c._0_4_ = uVar4;
  local_2c._4_4_ = propertyId;
  bVar2 = JsUtil::
          BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<JsUtil::Pair<unsigned_int,int,DefaultComparer>>
                    ((BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->m_propertyMap,(Pair<unsigned_int,_int,_DefaultComparer> *)local_2c,
                     (PropertySym **)&pair.second);
  if (bVar2) {
    if (*(int *)(pair._4_8_ + 0x18) != propertyId) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SymTable.cpp"
                         ,0xab,"(propertySym->m_propertyId == propertyId)",
                         "propertySym->m_propertyId == propertyId");
      if (!bVar2) goto LAB_0062de34;
      *puVar3 = 0;
    }
    if (*(uint *)(*(long *)(pair._4_8_ + 0x20) + 0x10) != uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SymTable.cpp"
                         ,0xac,"(propertySym->m_stackSym->m_id == stackSymID)",
                         "propertySym->m_stackSym->m_id == stackSymID");
      if (!bVar2) {
LAB_0062de34:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  else {
    pair._4_8_ = (PropertySym *)0x0;
  }
  return (PropertySym *)pair._4_8_;
}

Assistant:

PropertySym *
SymTable::FindPropertySym(SymID stackSymID, int32 propertyId) const
{
    PropertySym *  propertySym = nullptr;

    stackSymID += this->m_IDAdjustment;

    SymIdPropIdPair pair(stackSymID, propertyId);
    if (this->m_propertyMap->TryGetValue(pair, &propertySym))
    {
        Assert(propertySym->m_propertyId == propertyId);
        Assert(propertySym->m_stackSym->m_id == stackSymID);

        return propertySym;
    }
    return NULL;
}